

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tiny_obj_loader.h
# Opt level: O2

bool tinyobj::LoadObjWithCallback
               (istream *inStream,callback_t *callback,void *user_data,MaterialReader *readMatFn,
               string *warn,string *err)

{
  char cVar1;
  byte bVar2;
  undefined8 uVar3;
  _Alloc_hider _Var4;
  int iVar5;
  int iVar6;
  int iVar7;
  size_t sVar8;
  iterator iVar9;
  reference pvVar10;
  long lVar11;
  code *pcVar12;
  reference pvVar13;
  _Rb_tree_header *elems;
  char escape;
  char **extraout_RDX;
  char **token;
  char **extraout_RDX_00;
  byte *pbVar14;
  _Base_ptr p_Var15;
  ulong uVar16;
  vector<const_char_*,_std::allocator<const_char_*>_> *pvVar17;
  byte *pbVar18;
  real_t rVar19;
  real_t rVar20;
  real_t rVar21;
  real_t rVar22;
  undefined1 local_4b8 [40];
  real_t y;
  size_type local_488;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_480;
  string *local_470;
  vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_> indices;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  vector<const_char_*,_std::allocator<const_char_*>_> names_out;
  string linebuf;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_> materials;
  real_t z;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  material_map;
  index_t idx;
  undefined4 uStack_334;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_330 [23];
  stringstream errss;
  
  local_4b8._8_8_ = callback;
  local_4b8._16_8_ = user_data;
  local_4b8._24_8_ = warn;
  local_470 = err;
  std::__cxx11::stringstream::stringstream((stringstream *)&errss);
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &material_map._M_t._M_impl.super__Rb_tree_header._M_header;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  materials.super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       material_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::reserve(&names,2);
  elems = (_Rb_tree_header *)&names_out;
  names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  linebuf._M_dataplus._M_p = (pointer)&linebuf.field_2;
  linebuf._M_string_length = 0;
  names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  linebuf.field_2._M_local_buf[0] = '\0';
LAB_00146bf2:
  while( true ) {
    do {
      do {
        iVar5 = std::istream::peek();
        if (iVar5 == -1) {
          if (local_470 != (string *)0x0) {
            std::__cxx11::stringbuf::str();
            std::__cxx11::string::append((string *)local_470);
            std::__cxx11::string::~string((string *)&idx);
          }
          std::__cxx11::string::~string((string *)&linebuf);
          std::_Vector_base<const_char_*,_std::allocator<const_char_*>_>::~_Vector_base
                    (&names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::~vector(&names);
          std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::~vector
                    (&materials);
          std::_Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::~_Vector_base
                    (&indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>);
          std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
          ::~_Rb_tree(&material_map._M_t);
          std::__cxx11::stringstream::~stringstream((stringstream *)&errss);
          return true;
        }
        safeGetline(inStream,&linebuf);
      } while (((linebuf._M_string_length == 0) ||
               ((linebuf._M_dataplus._M_p[linebuf._M_string_length - 1] == '\n' &&
                (std::__cxx11::string::erase((ulong)&linebuf,linebuf._M_string_length - 1),
                linebuf._M_string_length == 0)))) ||
              ((linebuf._M_dataplus._M_p[linebuf._M_string_length - 1] == '\r' &&
               (std::__cxx11::string::erase((ulong)&linebuf,linebuf._M_string_length - 1),
               linebuf._M_string_length == 0))));
      _Var4._M_p = linebuf._M_dataplus._M_p;
      sVar8 = strspn(linebuf._M_dataplus._M_p," \t");
      pbVar18 = (byte *)(_Var4._M_p + sVar8);
      cVar1 = _Var4._M_p[sVar8];
      local_4b8._0_8_ = pbVar18;
    } while ((cVar1 == '\0') || (cVar1 == '#'));
    if (cVar1 != 'f') break;
    if ((pbVar18[1] != 0x20) && (pbVar18[1] != 9)) goto LAB_00146fdc;
    sVar8 = strspn((char *)(pbVar18 + 2)," \t");
    pbVar18 = pbVar18 + sVar8 + 2;
    local_4b8._0_8_ = pbVar18;
    if (indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
        super__Vector_impl_data._M_start) {
      indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
      super__Vector_impl_data._M_finish =
           indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
           super__Vector_impl_data._M_start;
    }
    while ((0xd < *pbVar18 ||
           (elems = (_Rb_tree_header *)0x2401, (0x2401U >> (*pbVar18 & 0x1f) & 1) == 0))) {
      iVar6 = atoi((char *)pbVar18);
      sVar8 = strcspn((char *)pbVar18,"/ \t\r");
      pbVar14 = pbVar18 + sVar8;
      iVar5 = 0;
      if (pbVar18[sVar8] == 0x2f) {
        if (pbVar14[1] == 0x2f) {
          pbVar14 = pbVar14 + 2;
          iVar7 = 0;
        }
        else {
          pbVar18 = pbVar14 + 1;
          iVar7 = atoi((char *)pbVar18);
          sVar8 = strcspn((char *)pbVar18,"/ \t\r");
          pbVar14 = pbVar18 + sVar8;
          if (pbVar18[sVar8] != 0x2f) goto LAB_00146e3d;
          pbVar14 = pbVar14 + 1;
        }
        iVar5 = atoi((char *)pbVar14);
        sVar8 = strcspn((char *)pbVar14,"/ \t\r");
        pbVar14 = pbVar14 + sVar8;
      }
      else {
        iVar7 = 0;
        iVar5 = 0;
      }
LAB_00146e3d:
      idx.normal_index = iVar5;
      idx.vertex_index = iVar6;
      stack0xfffffffffffffcc8 = CONCAT44(uStack_334,iVar7);
      std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::push_back(&indices,&idx);
      sVar8 = strspn((char *)pbVar14," \t\r");
      pbVar18 = pbVar14 + sVar8;
    }
    p_Var15 = *(_Base_ptr *)(local_4b8._8_8_ + 0x18);
    local_4b8._0_8_ = pbVar18;
    if ((p_Var15 != (_Base_ptr)0x0) &&
       (indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
        super__Vector_impl_data._M_finish !=
        indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>._M_impl.
        super__Vector_impl_data._M_start)) {
      pvVar13 = std::vector<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>::at(&indices,0);
      elems = (_Rb_tree_header *)0xc;
      uVar16 = ((long)indices.
                      super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
               (long)indices.super__Vector_base<tinyobj::index_t,_std::allocator<tinyobj::index_t>_>
                     ._M_impl.super__Vector_impl_data._M_start) / 0xc;
LAB_00146ee6:
      (*(code *)p_Var15)(local_4b8._16_8_,pvVar13,uVar16);
    }
  }
  if (cVar1 == 'v') {
    bVar2 = pbVar18[1];
    if (bVar2 == 9) {
LAB_00146cd8:
      local_4b8._0_8_ = pbVar18 + 2;
      rVar19 = parseReal((char **)local_4b8,0.0);
      rVar20 = parseReal((char **)local_4b8,0.0);
      rVar21 = parseReal((char **)local_4b8,0.0);
      rVar22 = parseReal((char **)local_4b8,1.0);
      if (*(code **)local_4b8._8_8_ != (code *)0x0) {
        (**(code **)local_4b8._8_8_)(rVar19,rVar20,rVar21,rVar22,local_4b8._16_8_);
      }
      goto LAB_00146bf2;
    }
    if (bVar2 == 0x74) {
      if ((pbVar18[2] == 0x20) || (pbVar18[2] == 9)) {
        local_4b8._0_8_ = pbVar18 + 3;
        elems = (_Rb_tree_header *)local_4b8;
        parseReal3((real_t *)&idx,&y,&z,(char **)local_4b8,0.0,0.0,0.0);
        if (*(_Base_ptr *)(local_4b8._8_8_ + 0x10) != (_Base_ptr)0x0) {
          (*(code *)*(_Base_ptr *)(local_4b8._8_8_ + 0x10))(idx.vertex_index,local_4b8._16_8_);
        }
        goto LAB_00146bf2;
      }
    }
    else if (bVar2 == 0x6e) {
      if ((pbVar18[2] == 0x20) || (pbVar18[2] == 9)) {
        local_4b8._0_8_ = pbVar18 + 3;
        elems = (_Rb_tree_header *)local_4b8;
        parseReal3((real_t *)&idx,&y,&z,(char **)local_4b8,0.0,0.0,0.0);
        if (*(_Base_ptr *)(local_4b8._8_8_ + 8) != (_Base_ptr)0x0) {
          (*(code *)*(_Base_ptr *)(local_4b8._8_8_ + 8))(idx.vertex_index,local_4b8._16_8_);
        }
        goto LAB_00146bf2;
      }
    }
    else if (bVar2 == 0x20) goto LAB_00146cd8;
  }
LAB_00146fdc:
  iVar5 = strncmp((char *)pbVar18,"usemtl",6);
  if ((iVar5 == 0) && ((pbVar18[6] == 0x20 || (pbVar18[6] == 9)))) {
    local_4b8._0_8_ = pbVar18 + 7;
    std::__cxx11::stringstream::stringstream((stringstream *)&idx);
    std::operator<<((ostream *)local_330[0]._M_local_buf,(char *)(pbVar18 + 7));
    std::__cxx11::stringbuf::str();
    iVar9 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::find(&material_map._M_t,(key_type *)&y);
    elems = &material_map._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)iVar9._M_node == elems) {
      elems = (_Rb_tree_header *)
              CONCAT71((int7)((ulong)elems >> 8),(_Base_ptr)local_4b8._24_8_ != (_Base_ptr)0x0);
      pcVar12 = *(code **)(local_4b8._8_8_ + 0x20);
      uVar16 = 0xffffffffffffffff;
      if (pcVar12 == (code *)0x0 && (_Base_ptr)local_4b8._24_8_ != (_Base_ptr)0x0) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &filenames,"material [ ",
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&y);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&z,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &filenames," ] not found in .mtl\n");
        std::__cxx11::string::append((string *)local_4b8._24_8_);
        std::__cxx11::string::~string((string *)&z);
        std::__cxx11::string::~string((string *)&filenames);
        uVar16 = 0xffffffffffffffff;
        goto LAB_00147477;
      }
    }
    else {
      uVar16 = (ulong)iVar9._M_node[2]._M_color;
LAB_00147477:
      pcVar12 = *(code **)(local_4b8._8_8_ + 0x20);
    }
    if (pcVar12 != (code *)0x0) {
      (*pcVar12)(local_4b8._16_8_,_y,uVar16);
    }
LAB_00147491:
    std::__cxx11::string::~string((string *)&y);
    std::__cxx11::stringstream::~stringstream((stringstream *)&idx);
  }
  else {
    iVar5 = strncmp((char *)pbVar18,"mtllib",6);
    if ((iVar5 == 0) && ((pbVar18[6] == 0x20 || (pbVar18[6] == 9)))) {
      if (readMatFn != (MaterialReader *)0x0) {
        local_4b8._0_8_ = pbVar18 + 7;
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        filenames.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        std::__cxx11::string::string((string *)&idx,(char *)local_4b8._0_8_,(allocator *)&y);
        SplitString((string *)&idx,(char)&filenames,escape,
                    (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)elems);
        std::__cxx11::string::~string((string *)&idx);
        if (filenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start ==
            filenames.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish) {
          if ((_Base_ptr)local_4b8._24_8_ != (_Base_ptr)0x0) {
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4b8._24_8_,
                       "Looks like empty filename for mtllib. Use default material. \n");
          }
        }
        else {
          pvVar17 = (vector<const_char_*,_std::allocator<const_char_*>_> *)0xffffffffffffffff;
          lVar11 = 0;
          do {
            elems = (_Rb_tree_header *)
                    ((long)filenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_finish -
                     (long)filenames.
                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start >> 5);
            pvVar17 = (vector<const_char_*,_std::allocator<const_char_*>_> *)
                      ((long)&(((_Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 *)&pvVar17->
                                    super__Vector_base<const_char_*,_std::allocator<const_char_*>_>)
                              ->_M_impl).super__Vector_impl_data._M_start + 1);
            if (elems <= pvVar17) {
              if ((_Base_ptr)local_4b8._24_8_ != (_Base_ptr)0x0) {
                std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
                append((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4b8._24_8_,"Failed to load material file(s). Use default material.\n");
              }
              goto LAB_0014752d;
            }
            idx._0_8_ = local_330;
            stack0xfffffffffffffcc8 = 0;
            _y = (pointer)&local_480;
            local_488 = 0;
            local_330[0]._M_local_buf[0] = '\0';
            local_480._M_local_buf[0] = '\0';
            std::__cxx11::string::string
                      ((string *)&z,
                       *(char **)((long)&((filenames.
                                           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus).
                                         _M_p + lVar11),(allocator *)(local_4b8 + 0x27));
            elems = (_Rb_tree_header *)&material_map;
            iVar5 = (*readMatFn->_vptr_MaterialReader[2])
                              (readMatFn,(string *)&z,&materials,elems,&idx,&y);
            std::__cxx11::string::~string((string *)&z);
            if (((_Base_ptr)local_4b8._24_8_ != (_Base_ptr)0x0) && (stack0xfffffffffffffcc8 != 0)) {
              std::__cxx11::string::append((string *)local_4b8._24_8_);
            }
            if ((local_470 != (string *)0x0) && (local_488 != 0)) {
              std::__cxx11::string::append((string *)local_470);
            }
            lVar11 = lVar11 + 0x20;
            std::__cxx11::string::~string((string *)&y);
            std::__cxx11::string::~string((string *)&idx);
          } while ((char)iVar5 == '\0');
          p_Var15 = ((_Base_ptr)(local_4b8._8_8_ + 0x20))->_M_parent;
          if (p_Var15 != (_Base_ptr)0x0) {
            pvVar10 = std::vector<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>::at
                                (&materials,0);
            elems = (_Rb_tree_header *)0x748;
            (*(code *)p_Var15)(local_4b8._16_8_,pvVar10,
                               ((long)materials.
                                      super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)materials.
                                     super__Vector_base<tinyobj::material_t,_std::allocator<tinyobj::material_t>_>
                                     ._M_impl.super__Vector_impl_data._M_start) / 0x748 & 0xffffffff
                              );
          }
        }
LAB_0014752d:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&filenames);
      }
    }
    else if (cVar1 == 'o') {
      if ((pbVar18[1] == 0x20) || (pbVar18[1] == 9)) {
        local_4b8._0_8_ = pbVar18 + 2;
        std::__cxx11::stringstream::stringstream((stringstream *)&idx);
        std::operator<<((ostream *)local_330[0]._M_local_buf,(char *)(pbVar18 + 2));
        std::__cxx11::stringbuf::str();
        if (((_Base_ptr)(local_4b8._8_8_ + 0x20))->_M_right != (_Base_ptr)0x0) {
          (*(code *)((_Base_ptr)(local_4b8._8_8_ + 0x20))->_M_right)(local_4b8._16_8_,_y);
        }
        goto LAB_00147491;
      }
    }
    else if ((cVar1 == 'g') && ((pbVar18[1] == 0x20 || (pbVar18[1] == 9)))) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::clear(&names);
      token = extraout_RDX;
      while ((0xd < *pbVar18 ||
             (elems = (_Rb_tree_header *)0x2401, (0x2401U >> (*pbVar18 & 0x1f) & 1) == 0))) {
        parseString_abi_cxx11_((string *)&idx,(tinyobj *)local_4b8,token);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&names,(string *)&idx);
        uVar3 = local_4b8._0_8_;
        sVar8 = strspn((char *)local_4b8._0_8_," \t\r");
        pbVar18 = (byte *)(uVar3 + sVar8);
        local_4b8._0_8_ = pbVar18;
        std::__cxx11::string::~string((string *)&idx);
        token = extraout_RDX_00;
      }
      if (((_Base_ptr)(local_4b8._8_8_ + 0x20))->_M_left != (_Base_ptr)0x0) {
        uVar16 = (long)names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)names.
                       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 5;
        if (1 < uVar16) {
          std::vector<const_char_*,_std::allocator<const_char_*>_>::resize(&names_out,uVar16 - 1);
          lVar11 = 0x20;
          for (elems = (_Rb_tree_header *)0x0;
              elems < (vector<const_char_*,_std::allocator<const_char_*>_> *)
                      ((long)names_out.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_finish -
                       (long)names_out.
                             super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl
                             .super__Vector_impl_data._M_start >> 3);
              elems = (_Rb_tree_header *)
                      ((long)&(((_Vector_impl *)&(elems->_M_header)._M_color)->
                              super__Vector_impl_data)._M_start + 1)) {
            names_out.super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
            super__Vector_impl_data._M_start[(long)elems] =
                 *(char **)((long)&((names.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_start)->_M_dataplus)._M_p +
                           lVar11);
            lVar11 = lVar11 + 0x20;
          }
          p_Var15 = ((_Base_ptr)(local_4b8._8_8_ + 0x20))->_M_left;
          pvVar13 = (reference)
                    std::vector<const_char_*,_std::allocator<const_char_*>_>::at(&names_out,0);
          uVar16 = (ulong)((long)names_out.
                                 super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                          (long)names_out.
                                super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                _M_impl.super__Vector_impl_data._M_start) >> 3;
          goto LAB_00146ee6;
        }
        (*(code *)((_Base_ptr)(local_4b8._8_8_ + 0x20))->_M_left)(local_4b8._16_8_,0,0);
      }
    }
  }
  goto LAB_00146bf2;
}

Assistant:

bool LoadObjWithCallback(std::istream &inStream, const callback_t &callback,
                         void *user_data /*= NULL*/,
                         MaterialReader *readMatFn /*= NULL*/,
                         std::string *warn, /* = NULL*/
                         std::string *err /*= NULL*/) {
  std::stringstream errss;

  // material
  std::map<std::string, int> material_map;
  int material_id = -1;  // -1 = invalid

  std::vector<index_t> indices;
  std::vector<material_t> materials;
  std::vector<std::string> names;
  names.reserve(2);
  std::vector<const char *> names_out;

  std::string linebuf;
  while (inStream.peek() != -1) {
    safeGetline(inStream, linebuf);

    // Trim newline '\r\n' or '\n'
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\n')
        linebuf.erase(linebuf.size() - 1);
    }
    if (linebuf.size() > 0) {
      if (linebuf[linebuf.size() - 1] == '\r')
        linebuf.erase(linebuf.size() - 1);
    }

    // Skip if empty line.
    if (linebuf.empty()) {
      continue;
    }

    // Skip leading space.
    const char *token = linebuf.c_str();
    token += strspn(token, " \t");

    assert(token);
    if (token[0] == '\0') continue;  // empty line

    if (token[0] == '#') continue;  // comment line

    // vertex
    if (token[0] == 'v' && IS_SPACE((token[1]))) {
      token += 2;
      // TODO(syoyo): Support parsing vertex color extension.
      real_t x, y, z, w;  // w is optional. default = 1.0
      parseV(&x, &y, &z, &w, &token);
      if (callback.vertex_cb) {
        callback.vertex_cb(user_data, x, y, z, w);
      }
      continue;
    }

    // normal
    if (token[0] == 'v' && token[1] == 'n' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;
      parseReal3(&x, &y, &z, &token);
      if (callback.normal_cb) {
        callback.normal_cb(user_data, x, y, z);
      }
      continue;
    }

    // texcoord
    if (token[0] == 'v' && token[1] == 't' && IS_SPACE((token[2]))) {
      token += 3;
      real_t x, y, z;  // y and z are optional. default = 0.0
      parseReal3(&x, &y, &z, &token);
      if (callback.texcoord_cb) {
        callback.texcoord_cb(user_data, x, y, z);
      }
      continue;
    }

    // face
    if (token[0] == 'f' && IS_SPACE((token[1]))) {
      token += 2;
      token += strspn(token, " \t");

      indices.clear();
      while (!IS_NEW_LINE(token[0])) {
        vertex_index_t vi = parseRawTriple(&token);

        index_t idx;
        idx.vertex_index = vi.v_idx;
        idx.normal_index = vi.vn_idx;
        idx.texcoord_index = vi.vt_idx;

        indices.push_back(idx);
        size_t n = strspn(token, " \t\r");
        token += n;
      }

      if (callback.index_cb && indices.size() > 0) {
        callback.index_cb(user_data, &indices.at(0),
                          static_cast<int>(indices.size()));
      }

      continue;
    }

    // use mtl
    if ((0 == strncmp(token, "usemtl", 6)) && IS_SPACE((token[6]))) {
      token += 7;
      std::stringstream ss;
      ss << token;
      std::string namebuf = ss.str();

      int newMaterialId = -1;
      std::map<std::string, int>::const_iterator it = material_map.find(namebuf);
      if (it != material_map.end()) {
        newMaterialId = it->second;
      } else {
        // { warn!! material not found }
        if (warn && (!callback.usemtl_cb)) {
          (*warn) += "material [ " + namebuf + " ] not found in .mtl\n";
        }
      }

      if (newMaterialId != material_id) {
        material_id = newMaterialId;
      }

      if (callback.usemtl_cb) {
        callback.usemtl_cb(user_data, namebuf.c_str(), material_id);
      }

      continue;
    }

    // load mtl
    if ((0 == strncmp(token, "mtllib", 6)) && IS_SPACE((token[6]))) {
      if (readMatFn) {
        token += 7;

        std::vector<std::string> filenames;
        SplitString(std::string(token), ' ', '\\', filenames);

        if (filenames.empty()) {
          if (warn) {
            (*warn) +=
                "Looks like empty filename for mtllib. Use default "
                "material. \n";
          }
        } else {
          bool found = false;
          for (size_t s = 0; s < filenames.size(); s++) {
            std::string warn_mtl;
            std::string err_mtl;
            bool ok = (*readMatFn)(filenames[s].c_str(), &materials,
                                   &material_map, &warn_mtl, &err_mtl);

            if (warn && (!warn_mtl.empty())) {
              (*warn) += warn_mtl;  // This should be warn message.
            }

            if (err && (!err_mtl.empty())) {
              (*err) += err_mtl;
            }

            if (ok) {
              found = true;
              break;
            }
          }

          if (!found) {
            if (warn) {
              (*warn) +=
                  "Failed to load material file(s). Use default "
                  "material.\n";
            }
          } else {
            if (callback.mtllib_cb) {
              callback.mtllib_cb(user_data, &materials.at(0),
                                 static_cast<int>(materials.size()));
            }
          }
        }
      }

      continue;
    }

    // group name
    if (token[0] == 'g' && IS_SPACE((token[1]))) {
      names.clear();

      while (!IS_NEW_LINE(token[0])) {
        std::string str = parseString(&token);
        names.push_back(str);
        token += strspn(token, " \t\r");  // skip tag
      }

      assert(names.size() > 0);

      if (callback.group_cb) {
        if (names.size() > 1) {
          // create const char* array.
          names_out.resize(names.size() - 1);
          for (size_t j = 0; j < names_out.size(); j++) {
            names_out[j] = names[j + 1].c_str();
          }
          callback.group_cb(user_data, &names_out.at(0),
                            static_cast<int>(names_out.size()));

        } else {
          callback.group_cb(user_data, NULL, 0);
        }
      }

      continue;
    }

    // object name
    if (token[0] == 'o' && IS_SPACE((token[1]))) {
      // @todo { multiple object name? }
      token += 2;

      std::stringstream ss;
      ss << token;
      std::string object_name = ss.str();

      if (callback.object_cb) {
        callback.object_cb(user_data, object_name.c_str());
      }

      continue;
    }

#if 0  // @todo
    if (token[0] == 't' && IS_SPACE(token[1])) {
      tag_t tag;

      token += 2;
      std::stringstream ss;
      ss << token;
      tag.name = ss.str();

      token += tag.name.size() + 1;

      tag_sizes ts = parseTagTriple(&token);

      tag.intValues.resize(static_cast<size_t>(ts.num_ints));

      for (size_t i = 0; i < static_cast<size_t>(ts.num_ints); ++i) {
        tag.intValues[i] = atoi(token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.floatValues.resize(static_cast<size_t>(ts.num_reals));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_reals); ++i) {
        tag.floatValues[i] = parseReal(&token);
        token += strcspn(token, "/ \t\r") + 1;
      }

      tag.stringValues.resize(static_cast<size_t>(ts.num_strings));
      for (size_t i = 0; i < static_cast<size_t>(ts.num_strings); ++i) {
        std::stringstream ss;
        ss << token;
        tag.stringValues[i] = ss.str();
        token += tag.stringValues[i].size() + 1;
      }

      tags.push_back(tag);
    }
#endif

    // Ignore unknown command.
  }

  if (err) {
    (*err) += errss.str();
  }

  return true;
}